

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

char * GetBytecodeFromPath(ParseContext *ctx,Lexeme *start,IntrusiveList<SynIdentifier> parts)

{
  int iVar1;
  char *pcVar2;
  _func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
  *p_Var3;
  char *pcVar4;
  char *pcVar5;
  ArrayView<InplaceStr> AVar6;
  InplaceStr IVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  InplaceStr *this;
  size_t sVar11;
  ErrorInfo *this_00;
  ErrorInfo *local_138;
  char *local_130;
  char *messageEnd;
  uint uStack_120;
  undefined4 uStack_11c;
  char *local_118;
  char *pcStack_110;
  char *local_100;
  char *pos;
  GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> allocator;
  ChunkedStackPool<65532> pool;
  char *messageStart;
  uint i;
  char *local_70;
  char *bytecode;
  TraceScope traceScope;
  undefined1 auStack_38 [8];
  InplaceStr moduleName;
  Lexeme *start_local;
  ParseContext *ctx_local;
  IntrusiveList<SynIdentifier> parts_local;
  
  moduleName.end = (char *)start;
  uVar9 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar9);
  _auStack_38 = GetModuleName(ctx->allocator,ctx->moduleRoot,parts);
  if ((GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::token == '\0') &&
     (iVar10 = __cxa_guard_acquire(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)
                                    ::token), iVar10 != 0)) {
    GetBytecodeFromPath::token = NULLC::TraceGetToken("parser","GetBytecodeFromPath");
    __cxa_guard_release(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::
                         token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bytecode,GetBytecodeFromPath::token);
  NULLC::TraceLabel((char *)auStack_38,moduleName.begin);
  local_70 = BinaryCache::FindBytecode((char *)auStack_38,false);
  if (local_70 == (char *)0x0) {
    _auStack_38 = GetModuleName(ctx->allocator,(char *)0x0,parts);
    local_70 = BinaryCache::FindBytecode(auStack_38,false);
  }
  for (messageStart._4_4_ = 0; uVar9 = SmallArray<InplaceStr,_8U>::size(&ctx->activeImports),
      messageStart._4_4_ < uVar9; messageStart._4_4_ = messageStart._4_4_ + 1) {
    this = SmallArray<InplaceStr,_8U>::operator[](&ctx->activeImports,messageStart._4_4_);
    bVar8 = InplaceStr::operator==(this,(InplaceStr *)auStack_38);
    pcVar2 = moduleName.end;
    if (bVar8) {
      uVar9 = InplaceStr::length((InplaceStr *)auStack_38);
      anon_unknown.dwarf_fc7e::Stop
                (ctx,(Lexeme *)pcVar2,"ERROR: found cyclic dependency on module \'%.*s\'",
                 (ulong)uVar9,auStack_38);
    }
  }
  SmallArray<InplaceStr,_8U>::push_back(&ctx->activeImports,(InplaceStr *)auStack_38);
  if (local_70 == (char *)0x0) {
    if (ctx->bytecodeBuilder ==
        (_func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
         *)0x0) {
      anon_unknown.dwarf_fc7e::Stop
                (ctx,(Lexeme *)moduleName.end,"ERROR: import builder is not provided");
    }
    if (ctx->errorCount == 0) {
      ctx->errorPos = *(char **)(moduleName.end + 8);
      ctx->errorBufLocation = ctx->errorBuf;
    }
    pcVar2 = ctx->errorBufLocation;
    ChunkedStackPool<65532>::ChunkedStackPool
              ((ChunkedStackPool<65532> *)&allocator.largeObjects.max);
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::GrowingAllocatorRef
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)&pos,
               (ChunkedStackPool<65532> *)&allocator.largeObjects.max);
    uVar9 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&ctx->statistics,"Extra",uVar9);
    local_100 = (char *)0x0;
    p_Var3 = ctx->bytecodeBuilder;
    local_118 = (char *)auStack_38;
    pcStack_110 = moduleName.begin;
    pcVar4 = ctx->moduleRoot;
    pcVar5 = ctx->errorBufLocation;
    uVar9 = ctx->errorBufSize;
    iVar10 = *(int *)&ctx->errorBuf;
    iVar1 = ctx->optimizationLevel;
    ArrayView<InplaceStr>::ArrayView<8u>((ArrayView<InplaceStr> *)&messageEnd,&ctx->activeImports);
    IVar7.end = pcStack_110;
    IVar7.begin = local_118;
    AVar6.count = uStack_120;
    AVar6._12_4_ = uStack_11c;
    AVar6.data = (InplaceStr *)messageEnd;
    local_70 = (*p_Var3)((Allocator *)&pos,IVar7,pcVar4,false,&local_100,pcVar5,
                         uVar9 + (iVar10 - (int)pcVar5),iVar1,AVar6,&ctx->statistics);
    uVar9 = NULLCTime::clockMicro();
    CompilerStatistics::Start(&ctx->statistics,uVar9);
    if (local_70 == (char *)0x0) {
      if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
        sVar11 = strlen(ctx->errorBufLocation);
        ctx->errorBufLocation = ctx->errorBufLocation + sVar11;
        local_130 = ctx->errorBufLocation;
        this_00 = ParseContext::get<ErrorInfo>(ctx);
        ErrorInfo::ErrorInfo
                  (this_00,ctx->allocator,pcVar2,local_130,(Lexeme *)moduleName.end,
                   (Lexeme *)moduleName.end,local_100);
        local_138 = this_00;
        SmallArray<ErrorInfo_*,_4U>::push_back(&ctx->errorInfo,&local_138);
        AddErrorLocationInfo
                  (ctx->code,local_100,ctx->errorBufLocation,
                   ctx->errorBufSize + (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation));
        sVar11 = strlen(ctx->errorBufLocation);
        ctx->errorBufLocation = ctx->errorBufLocation + sVar11;
      }
      ctx->errorCount = ctx->errorCount + 1;
    }
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::~GrowingAllocatorRef
              ((GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *)&pos);
    ChunkedStackPool<65532>::~ChunkedStackPool
              ((ChunkedStackPool<65532> *)&allocator.largeObjects.max);
  }
  uVar9 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Extra",uVar9);
  NULLC::TraceScope::~TraceScope((TraceScope *)&bytecode);
  return local_70;
}

Assistant:

const char* GetBytecodeFromPath(ParseContext &ctx, Lexeme *start, IntrusiveList<SynIdentifier> parts)
{
	ctx.statistics.Start(NULLCTime::clockMicro());

	InplaceStr moduleName = GetModuleName(ctx.allocator, ctx.moduleRoot, parts);

	TRACE_SCOPE("parser", "GetBytecodeFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	const char *bytecode = BinaryCache::FindBytecode(moduleName.begin, false);

	if(!bytecode)
	{
		moduleName = GetModuleName(ctx.allocator, NULL, parts);

		bytecode = BinaryCache::FindBytecode(moduleName.begin, false);
	}

	for(unsigned i = 0; i < ctx.activeImports.size(); i++)
	{
		if(ctx.activeImports[i] == moduleName)
			Stop(ctx, start, "ERROR: found cyclic dependency on module '%.*s'", moduleName.length(), moduleName.begin);
	}

	ctx.activeImports.push_back(moduleName);

	if(!bytecode)
	{
		if(!ctx.bytecodeBuilder)
			Stop(ctx, start, "ERROR: import builder is not provided");

		if(ctx.errorCount == 0)
		{
			ctx.errorPos = start->pos;
			ctx.errorBufLocation = ctx.errorBuf;
		}

		const char *messageStart = ctx.errorBufLocation;

		// Separate allocator for each module
		ChunkedStackPool<65532> pool;
		GrowingAllocatorRef<ChunkedStackPool<65532>, 16384> allocator(pool);

		ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

		const char *pos = NULL;
		bytecode = ctx.bytecodeBuilder(&allocator, moduleName, ctx.moduleRoot, false, &pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), ctx.optimizationLevel, ctx.activeImports, &ctx.statistics);

		ctx.statistics.Start(NULLCTime::clockMicro());

		if(!bytecode)
		{
			if(ctx.errorBuf && ctx.errorBufSize)
			{
				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, start, start, pos));

				AddErrorLocationInfo(ctx.code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			ctx.errorCount++;
		}
	}

	ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

	return bytecode;
}